

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  u8 uVar1;
  char cVar2;
  long lVar3;
  Fts3DeferredToken *pFVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int *in_RCX;
  uint in_EDX;
  Fts3Cursor *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  Fts3Phrase *pPh;
  Fts3Expr *pTest;
  int bEofSave;
  int bMatch;
  Fts3Expr *pRun;
  Fts3Expr *pNear;
  Fts3Expr *p;
  u8 bTreeEof;
  int bOr;
  int bDescDoclist;
  Fts3Table *pTab;
  Fts3Phrase *pPhrase;
  int dummy;
  u8 bEof;
  int rc;
  sqlite3_int64 iDocid;
  int iThis;
  char *pIter;
  u8 *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char **in_stack_ffffffffffffff30;
  byte *pbVar9;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff53;
  int in_stack_ffffffffffffff54;
  ushort uVar11;
  undefined2 uVar12;
  uint in_stack_ffffffffffffff5c;
  ulong *aDoclist;
  Fts3Cursor *pFVar13;
  Fts3Cursor *local_88;
  Fts3Cursor *local_80;
  Fts3Cursor *local_78;
  u8 *pbEof;
  undefined4 in_stack_ffffffffffffffb8;
  int local_30;
  bool local_25;
  int local_24;
  uint local_14;
  byte *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&in_RSI->iLangid;
  pbEof = (u8 *)*in_RDI;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_14 = 0xaaaaaaaa;
  in_RCX[0] = 0;
  in_RCX[1] = 0;
  if ((*(int *)(lVar3 + 0x54) < *(int *)(pbEof + 0x30)) && (*(uint *)(lVar3 + 0x54) != in_EDX)) {
    local_30 = 0;
  }
  else {
    pFVar4 = in_RSI->pDeferred;
    local_10 = *(byte **)(lVar3 + 0x28);
    if ((pFVar4 == (Fts3DeferredToken *)in_RDI[6]) && ((char)in_RSI->iPrevId == '\0')) {
LAB_0025e455:
      if (local_10 == (byte *)0x0) {
        local_30 = 0;
      }
      else {
        if (*local_10 == 1) {
          local_10 = local_10 + 1;
          if ((*local_10 & 0x80) == 0) {
            local_14 = (uint)*local_10;
            iVar7 = 1;
          }
          else {
            iVar7 = sqlite3Fts3GetVarint32((char *)local_10,(int *)&local_14);
          }
          local_10 = local_10 + iVar7;
        }
        else {
          local_14 = 0;
        }
        while ((int)local_14 < (int)in_EDX) {
          fts3ColumnlistCopy(in_stack_ffffffffffffff30,
                             (char **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
          ;
          if (*local_10 == 0) {
            local_30 = 0;
            goto LAB_0025e62a;
          }
          local_10 = local_10 + 1;
          if ((*local_10 & 0x80) == 0) {
            local_14 = (uint)*local_10;
            iVar7 = 1;
          }
          else {
            iVar7 = sqlite3Fts3GetVarint32((char *)local_10,(int *)&local_14);
          }
          local_10 = local_10 + iVar7;
        }
        if (*local_10 == 0) {
          local_10 = (byte *)0x0;
        }
        pbVar9 = local_10;
        if (in_EDX != local_14) {
          pbVar9 = (byte *)0x0;
        }
        *(byte **)in_RCX = pbVar9;
        local_30 = 0;
      }
    }
    else {
      local_24 = 0;
      uVar1 = pbEof[0x1cf];
      bVar6 = false;
      bVar8 = false;
      local_80 = in_RSI;
      for (local_78 = *(Fts3Cursor **)&in_RSI->eSearch; local_78 != (Fts3Cursor *)0x0;
          local_78 = *(Fts3Cursor **)&local_78->eSearch) {
        if (*(int *)&(local_78->base).pVtab == 4) {
          bVar6 = true;
        }
        if (*(int *)&(local_78->base).pVtab == 1) {
          local_80 = local_78;
        }
        if ((char)local_78->iPrevId != '\0') {
          bVar8 = true;
        }
      }
      if (bVar6) {
        for (local_88 = local_80; *(char *)((long)&local_88->iPrevId + 2) != '\0';
            local_88 = *(Fts3Cursor **)&local_88->eSearch) {
        }
        if (*(int *)(lVar3 + 0x38) != 0) {
          cVar2 = (char)local_88->iPrevId;
          fts3EvalRestart((Fts3Cursor *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (Fts3Expr *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (int *)in_stack_ffffffffffffff30);
          do {
            in_stack_ffffffffffffff5c =
                 CONCAT13((char)local_88->iPrevId != '\0',(int3)in_stack_ffffffffffffff5c) ^
                 0xff000000;
            if ((in_stack_ffffffffffffff5c & 0x1000000) == 0) break;
            fts3EvalNextRow(in_RSI,(Fts3Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),in_RCX);
          } while ((cVar2 != '\0') || (local_88->pDeferred != pFVar4));
          if ((char)local_88->iPrevId != cVar2) {
            local_24 = 0x10b;
          }
        }
        if (bVar8) {
          while( true ) {
            uVar10 = (undefined1)(in_stack_ffffffffffffff5c >> 0x18);
            uVar11 = (ushort)in_stack_ffffffffffffff5c;
            in_stack_ffffffffffffff5c = CONCAT13(uVar10,(uint3)uVar11);
            if (local_24 == 0) {
              in_stack_ffffffffffffff5c =
                   CONCAT13(uVar10,CONCAT12((char)local_88->iPrevId != '\0',uVar11)) ^ 0xff0000;
            }
            if ((in_stack_ffffffffffffff5c & 0x10000) == 0) break;
            fts3EvalNextRow(in_RSI,(Fts3Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),in_RCX);
          }
        }
        if (local_24 == 0) {
          bVar6 = true;
          local_78 = local_80;
LAB_0025e0d6:
          if (local_78 != (Fts3Cursor *)0x0) {
            pFVar13 = local_78;
            if (*(int *)&(local_78->base).pVtab == 1) {
              pFVar13 = (Fts3Cursor *)local_78->pExpr;
            }
            aDoclist = *(ulong **)&pFVar13->iLangid;
            local_10 = (byte *)aDoclist[8];
            uVar5 = aDoclist[9];
            if (*(u8 *)((long)in_RDI + 0x4c) != uVar1) {
              local_25 = true;
              uVar10 = local_25;
              if (((int)aDoclist[1] != 0) &&
                 (in_stack_ffffffffffffff51 = false, uVar10 = in_stack_ffffffffffffff51,
                 local_25 = (bool)in_stack_ffffffffffffff51, local_10 != (byte *)0x0)) {
                in_stack_ffffffffffffff51 = local_10 <= *aDoclist;
                uVar10 = in_stack_ffffffffffffff51;
                local_25 = (bool)in_stack_ffffffffffffff51;
              }
              do {
                if (local_10 == (byte *)0x0) {
LAB_0025e35a:
                  in_stack_ffffffffffffff44 =
                       CONCAT13(local_25 == false,(int3)in_stack_ffffffffffffff44);
                }
                else {
                  in_stack_ffffffffffffff4c = 1;
                  if (uVar1 != '\0') {
                    in_stack_ffffffffffffff4c = -1;
                  }
                  if (in_RDI[6] < (long)uVar5) {
                    in_stack_ffffffffffffff48 = 1;
                  }
                  else {
                    in_stack_ffffffffffffff48 = -1;
                    if (uVar5 == in_RDI[6]) {
                      in_stack_ffffffffffffff48 = 0;
                    }
                  }
                  in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff;
                  if (0 < in_stack_ffffffffffffff4c * in_stack_ffffffffffffff48) goto LAB_0025e35a;
                }
                if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') goto LAB_0025e3c8;
                sqlite3Fts3DoclistPrev
                          ((int)((ulong)pFVar13 >> 0x20),(char *)aDoclist,in_stack_ffffffffffffff5c,
                           (char **)CONCAT44(in_stack_ffffffffffffff54,
                                             CONCAT13(in_stack_ffffffffffffff53,
                                                      CONCAT12(uVar10,CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50)))),
                           (sqlite3_int64 *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           pbEof);
              } while( true );
            }
            uVar12 = CONCAT11(1,(char)in_stack_ffffffffffffff5c);
            if ((int)aDoclist[1] != 0) {
              uVar12 = CONCAT11(*aDoclist + (long)(int)aDoclist[1] <= local_10,
                                (char)in_stack_ffffffffffffff5c);
            }
            in_stack_ffffffffffffff5c = CONCAT22((short)(in_stack_ffffffffffffff5c >> 0x10),uVar12);
            local_25 = SUB21((ushort)uVar12 >> 8,0);
            do {
              if (local_10 == (byte *)0x0) {
LAB_0025e22d:
                bVar8 = local_25 == false;
              }
              else {
                iVar7 = 1;
                if (uVar1 != '\0') {
                  iVar7 = -1;
                }
                if (in_RDI[6] < (long)uVar5) {
                  in_stack_ffffffffffffff54 = 1;
                }
                else {
                  in_stack_ffffffffffffff54 = -1;
                  if (uVar5 == in_RDI[6]) {
                    in_stack_ffffffffffffff54 = 0;
                  }
                }
                bVar8 = false;
                if (iVar7 * in_stack_ffffffffffffff54 < 0) goto LAB_0025e22d;
              }
              if (!bVar8) goto LAB_0025e282;
              sqlite3Fts3DoclistNext
                        (in_stack_ffffffffffffff4c,
                         (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                         (sqlite3_int64 *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         in_stack_ffffffffffffff20);
            } while( true );
          }
          if (bVar6) {
            local_10 = *(byte **)(lVar3 + 0x40);
          }
          else {
            local_10 = (byte *)0x0;
          }
          goto LAB_0025e455;
        }
        local_30 = local_24;
      }
      else {
        local_30 = 0;
      }
    }
  }
LAB_0025e62a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
LAB_0025e282:
  in_stack_ffffffffffffff53 = 0;
LAB_0025e3c8:
  aDoclist[8] = (ulong)local_10;
  aDoclist[9] = uVar5;
  if ((local_25 != false) || (uVar5 != in_RDI[6])) {
    bVar6 = false;
  }
  local_78 = (Fts3Cursor *)local_78->pStmt;
  goto LAB_0025e0d6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    Fts3Expr *pRun;               /* Closest non-deferred ancestor of pNear */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not,
    ** return NULL. Otherwise, the entry that corresponds to docid
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;
    pRun = pNear;
    while( pRun->bDeferred ){
      assert( pRun->pParent );
      pRun = pRun->pParent;
    }

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pRun->bEof;
      fts3EvalRestart(pCsr, pRun, &rc);
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
        if( bEofSave==0 && pRun->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
      if( rc==SQLITE_OK && pRun->bEof!=bEofSave ){
        rc = FTS_CORRUPT_VTAB;
      }
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}